

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int32 it_read_sample_data(IT_SAMPLE *sample,uchar convert,DUMBFILE *f)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  int32 iVar6;
  int iVar7;
  short *data;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint len;
  
  iVar3 = sample->length;
  bVar2 = sample->flags;
  bVar8 = bVar2 >> 2 & 1;
  uVar10 = iVar3 << bVar8;
  data = (short *)malloc((long)(int)(uVar10 << (bVar2 >> 1 & 1)));
  sample->data = data;
  if (data == (short *)0x0) {
    return -1;
  }
  if (convert == 0xff && (char)((bVar2 & 2) >> 1) == '\0') {
    iVar6 = _dumb_it_read_sample_data_adpcm4(sample,f);
    if (iVar6 < 0) {
      return -1;
    }
    goto LAB_005b929a;
  }
  if ((bVar2 & 8) == 0) {
    if ((bVar2 & 2) == 0) {
      if ((bVar2 & 4) == 0) {
        if (0 < iVar3 << bVar8) {
          uVar9 = 0;
          do {
            iVar7 = dumbfile_getc(f);
            *(char *)((long)sample->data + uVar9) = (char)iVar7;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
      }
      else {
        if (0 < iVar3 << bVar8) {
          lVar11 = 0;
          do {
            iVar7 = dumbfile_getc(f);
            *(char *)((long)sample->data + lVar11) = (char)iVar7;
            lVar11 = lVar11 + 2;
          } while ((int)lVar11 < (int)uVar10);
        }
        if (1 < (int)uVar10) {
          lVar11 = 1;
          do {
            iVar7 = dumbfile_getc(f);
            *(char *)((long)sample->data + lVar11) = (char)iVar7;
            lVar11 = lVar11 + 2;
          } while ((int)lVar11 < (int)uVar10);
        }
      }
    }
    else if ((bVar2 & 4) == 0) {
      if ((convert & 2) == 0) {
        if (0 < iVar3 << bVar8) {
          uVar9 = 0;
          do {
            iVar7 = dumbfile_igetw(f);
            *(short *)((long)sample->data + uVar9 * 2) = (short)iVar7;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
      }
      else if (0 < iVar3 << bVar8) {
        uVar9 = 0;
        do {
          iVar7 = dumbfile_mgetw(f);
          *(short *)((long)sample->data + uVar9 * 2) = (short)iVar7;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
    }
    else if ((convert & 2) == 0) {
      if (0 < iVar3 << bVar8) {
        lVar11 = 0;
        do {
          iVar7 = dumbfile_igetw(f);
          *(short *)((long)sample->data + lVar11 * 2) = (short)iVar7;
          lVar11 = lVar11 + 2;
        } while ((int)lVar11 < (int)uVar10);
      }
      if (1 < (int)uVar10) {
        lVar11 = 1;
        do {
          iVar7 = dumbfile_igetw(f);
          *(short *)((long)sample->data + lVar11 * 2) = (short)iVar7;
          lVar11 = lVar11 + 2;
        } while ((int)lVar11 < (int)uVar10);
      }
    }
    else {
      if (0 < iVar3 << bVar8) {
        lVar11 = 0;
        do {
          iVar7 = dumbfile_mgetw(f);
          *(short *)((long)sample->data + lVar11 * 2) = (short)iVar7;
          lVar11 = lVar11 + 2;
        } while ((int)lVar11 < (int)uVar10);
      }
      if (1 < (int)uVar10) {
        lVar11 = 1;
        do {
          iVar7 = dumbfile_mgetw(f);
          *(short *)((long)sample->data + lVar11 * 2) = (short)iVar7;
          lVar11 = lVar11 + 2;
        } while ((int)lVar11 < (int)uVar10);
      }
    }
    goto LAB_005b929a;
  }
  uVar5 = (uint)convert;
  if ((bVar2 & 4) == 0) {
    iVar7 = 0;
    len = uVar10;
    if ((bVar2 & 2) != 0) {
LAB_005b928f:
      decompress16(f,data,len,uVar5 & 4,iVar7);
      goto LAB_005b929a;
    }
  }
  else {
    len = (int)uVar10 >> 1;
    if ((bVar2 & 2) != 0) {
      decompress16(f,data,len,uVar5 & 4,1);
      data = (short *)((long)sample->data + 2);
      iVar7 = 1;
      goto LAB_005b928f;
    }
    decompress8(f,(char *)data,len,uVar5 & 4,1);
    data = (short *)((long)sample->data + 1);
    iVar7 = 1;
  }
  decompress8(f,(char *)data,len,uVar5 & 4,iVar7);
LAB_005b929a:
  iVar7 = dumbfile_error(f);
  iVar6 = -1;
  if (iVar7 == 0) {
    iVar6 = 0;
    if ((convert & 1) == 0) {
      iVar6 = 0;
      if ((sample->flags & 2) == 0) {
        if (0 < iVar3 << bVar8) {
          iVar6 = 0;
          uVar9 = 0;
          do {
            pbVar1 = (byte *)((long)sample->data + uVar9);
            *pbVar1 = *pbVar1 ^ 0x80;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
      }
      else if (0 < iVar3 << bVar8) {
        pvVar4 = sample->data;
        iVar6 = 0;
        uVar9 = 0;
        do {
          pbVar1 = (byte *)((long)pvVar4 + uVar9 * 2 + 1);
          *pbVar1 = *pbVar1 ^ 0x80;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
    }
  }
  return iVar6;
}

Assistant:

static int32 it_read_sample_data(IT_SAMPLE *sample, unsigned char convert, DUMBFILE *f)
{
	int32 n;

	int32 datasize = sample->length;
	if (sample->flags & IT_SAMPLE_STEREO) datasize <<= 1;

	sample->data = malloc(datasize * (sample->flags & IT_SAMPLE_16BIT ? 2 : 1));
	if (!sample->data)
		return -1;

	if (!(sample->flags & IT_SAMPLE_16BIT) && (convert == 0xFF)) {
		if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
			return -1;
	} else if (sample->flags & 8) {
		/* If the sample is packed, then we must unpack it. */

		/* Behavior as defined by greasemonkey's munch.py and observed by XMPlay and OpenMPT */

		if (sample->flags & IT_SAMPLE_STEREO) {
			if (sample->flags & IT_SAMPLE_16BIT) {
				decompress16(f, (short *) sample->data, datasize >> 1, convert & 4, 1);
				decompress16(f, (short *) sample->data + 1, datasize >> 1, convert & 4, 1);
			} else {
				decompress8(f, (signed char *) sample->data, datasize >> 1, convert & 4, 1);
				decompress8(f, (signed char *) sample->data + 1, datasize >> 1, convert & 4, 1);
			}
		} else {
			if (sample->flags & IT_SAMPLE_16BIT)
				decompress16(f, (short *) sample->data, datasize, convert & 4, 0);
			else
				decompress8(f, (signed char *) sample->data, datasize, convert & 4, 0);
		}
 	} else if (sample->flags & IT_SAMPLE_16BIT) {
		if (sample->flags & IT_SAMPLE_STEREO) {
			if (convert & 2) {
				for (n = 0; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_mgetw(f);
				for (n = 1; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_mgetw(f);
			} else {
				for (n = 0; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_igetw(f);
				for (n = 1; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_igetw(f);
			}
		} else {
 			if (convert & 2)
				for (n = 0; n < datasize; n++)
					((short *)sample->data)[n] = dumbfile_mgetw(f);
			else
				for (n = 0; n < datasize; n++)
					((short *)sample->data)[n] = dumbfile_igetw(f);
		}
 	} else {
		if (sample->flags & IT_SAMPLE_STEREO) {
			for (n = 0; n < datasize; n += 2)
				((signed char *)sample->data)[n] = dumbfile_getc(f);
			for (n = 1; n < datasize; n += 2)
				((signed char *)sample->data)[n] = dumbfile_getc(f);
		} else
			for (n = 0; n < datasize; n++)
				((signed char *)sample->data)[n] = dumbfile_getc(f);
	}

	if (dumbfile_error(f))
		return -1;

	if (!(convert & 1)) {
		/* Convert to signed. */
		if (sample->flags & IT_SAMPLE_16BIT)
			for (n = 0; n < datasize; n++)
				((short *)sample->data)[n] ^= 0x8000;
		else
			for (n = 0; n < datasize; n++)
				((signed char *)sample->data)[n] ^= 0x80;
	}

	/* NOT SUPPORTED:
	 *
	 * convert &  4 - Samples stored as delta values
	 * convert & 16 - Samples stored as TX-Wave 12-bit values
	 * convert & 32 - Left/Right/All Stereo prompt
	 */

	return 0;
}